

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void entergen(lua_State *L,global_State *g)

{
  luaC_runtilstate(L,8,1);
  luaC_runtilstate(L,0,1);
  atomic(L);
  atomic2gen(L,g);
  setminordebt(g);
  return;
}

Assistant:

static void entergen (lua_State *L, global_State *g) {
  luaC_runtilstate(L, GCSpause, 1);  /* prepare to start a new cycle */
  luaC_runtilstate(L, GCSpropagate, 1);  /* start new cycle */
  atomic(L);  /* propagates all and then do the atomic stuff */
  atomic2gen(L, g);
  setminordebt(g);  /* set debt assuming next cycle will be minor */
}